

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::NeuralNetworkClassifier::_InternalParse
          (NeuralNetworkClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  uint uVar3;
  NeuralNetworkLayer *msg;
  NeuralNetworkPreprocessing *msg_00;
  uint64_t uVar4;
  NetworkUpdateParameters *msg_01;
  StringVector *msg_02;
  Int64Vector *msg_03;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str;
  uint64_t val_1;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  NeuralNetworkClassifier *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0035f0af:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    pPVar1 = pPStack_20;
    tag_00 = val._4_4_;
    uVar3 = val._4_4_ >> 3;
    if (uVar3 == 1) {
      if ((val._4_4_ & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_layers(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar2));
        goto LAB_0035f0af;
      }
LAB_0035f44e:
      if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
    else {
      if (uVar3 == 2) {
        if ((val._4_4_ & 0xff) != 0x12) goto LAB_0035f44e;
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg_00 = _internal_add_preprocessing(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg_00->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<18u>((char *)ctx_local), bVar2));
        goto LAB_0035f0af;
      }
      if (uVar3 == 5) {
        if ((val._4_4_ & 0xff) != 0x28) goto LAB_0035f44e;
        uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_arrayinputshapemapping(this,(NeuralNetworkMultiArrayShapeMapping)uVar4);
        goto LAB_0035f0af;
      }
      if (uVar3 == 6) {
        if ((val._4_4_ & 0xff) != 0x30) goto LAB_0035f44e;
        uVar4 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_imageinputshapemapping(this,(NeuralNetworkImageShapeMapping)uVar4);
        goto LAB_0035f0af;
      }
      if (uVar3 == 10) {
        if ((val._4_4_ & 0xff) != 0x52) goto LAB_0035f44e;
        msg_01 = _internal_mutable_updateparams(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (pPVar1,&msg_01->super_MessageLite,(char *)ctx_local);
      }
      else if (uVar3 == 100) {
        if ((val._4_4_ & 0xff) != 0x22) goto LAB_0035f44e;
        msg_02 = _internal_mutable_stringclasslabels(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (pPVar1,&msg_02->super_MessageLite,(char *)ctx_local);
      }
      else if (uVar3 == 0x65) {
        if ((val._4_4_ & 0xff) != 0x2a) goto LAB_0035f44e;
        msg_03 = _internal_mutable_int64classlabels(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::ParseMessage
                              (pPVar1,&msg_03->super_MessageLite,(char *)ctx_local);
      }
      else {
        if ((uVar3 != 200) || ((val._4_4_ & 0xff) != 0x42)) goto LAB_0035f44e;
        s = _internal_mutable_labelprobabilitylayername_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (s,(char *)ctx_local,pPStack_20);
        bVar2 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return (char *)0x0;
        }
      }
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* NeuralNetworkClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string labelProbabilityLayerName = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_labelprobabilitylayername();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}